

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcPile::~IfcPile(IfcPile *this)

{
  ~IfcPile((IfcPile *)&this[-1].field_0x70);
  return;
}

Assistant:

IfcPile() : Object("IfcPile") {}